

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O2

void statistics(string *clusters_path)

{
  unsigned_long uVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  int i;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint64_t j;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint16_t length;
  ulong local_270;
  ulong local_268;
  long local_260;
  vector<unsigned_long,_std::allocator<unsigned_long>_> clust_len_freq;
  uint64_t start;
  ifstream clusters;
  byte abStack_218 [488];
  
  std::ifstream::ifstream((string *)&clusters);
  std::ifstream::open((string *)&clusters,(_Ios_Openmode)clusters_path);
  local_268 = (ulong)max_clust_length;
  start = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&clust_len_freq,local_268 + 1,&start,(allocator_type *)&length);
  local_270 = 0;
  while ((abStack_218[*(long *)(_clusters + -0x18)] & 2) == 0) {
    std::istream::read((char *)&clusters,(long)&start);
    std::istream::read((char *)&clusters,(long)&length);
    uVar3 = (ulong)length;
    if ((uVar3 <= local_268) &&
       (clust_len_freq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] =
             clust_len_freq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar3] + 1, local_270 <= uVar3)) {
      local_270 = uVar3;
    }
    n_clust = n_clust + 1;
    n_bases = n_bases + uVar3;
  }
  uVar7 = 0;
  for (uVar3 = 1; (int)local_268 + 1 != uVar3; uVar3 = uVar3 + 1) {
    uVar5 = clust_len_freq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start[uVar3] * uVar3;
    if (uVar7 <= uVar5 && uVar5 - uVar7 != 0) {
      uVar7 = uVar5;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\nDistribution of base coverage: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\ncluster length\t# bases in a cluster with this length\t cumulative fraction (from 2m = "
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,mcov_out * 2);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_260 = 0;
  for (uVar3 = 0; uVar3 <= local_270; uVar3 = uVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar3);
    std::operator<<(poVar2,"\t");
    std::ostream::flush();
    for (uVar5 = 0;
        uVar5 < (clust_len_freq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar3] * uVar3 * 100) / uVar7;
        uVar5 = uVar5 + 1) {
      std::operator<<((ostream *)&std::cout,"-");
      std::ostream::flush();
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"\t");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ostream::flush();
    if (SBORROW8(uVar3,(long)mcov_out * 2) == (long)(uVar3 + (long)mcov_out * -2) < 0) {
      uVar1 = clust_len_freq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar3];
      std::operator<<((ostream *)&std::cout,"\t");
      local_260 = local_260 + uVar1 * uVar3;
      auVar8._8_4_ = (int)((ulong)local_260 >> 0x20);
      auVar8._0_8_ = local_260;
      auVar8._12_4_ = 0x45300000;
      auVar9._8_4_ = (int)(n_bases >> 0x20);
      auVar9._0_8_ = n_bases;
      auVar9._12_4_ = 0x45300000;
      std::ostream::_M_insert<double>
                (((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_260) - 4503599627370496.0)) /
                 ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)n_bases) - 4503599627370496.0)));
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  lVar6 = (long)mcov_out;
  uVar3 = lVar6 * 2;
  max_clust_length = (int)uVar3;
  lVar4 = lVar6 * 2;
  lVar6 = uVar3 * clust_len_freq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar6 * 2];
  while (lVar4 = lVar4 + 1, auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20), auVar10._0_8_ = lVar6,
        auVar10._12_4_ = 0x45300000,
        ((auVar10._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) *
        (1.0 / (((double)CONCAT44(0x45300000,(int)(n_bases >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)n_bases) - 4503599627370496.0))) < pval) {
    if ((uint)local_268 <= (uint)uVar3) break;
    max_clust_length = (uint)uVar3 + 1;
    uVar3 = (ulong)(uint)max_clust_length;
    lVar6 = lVar6 + clust_len_freq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar4] * lVar4;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\nCluster sizes allowed: [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,mcov_out * 2);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,max_clust_length);
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ifstream::close();
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&clust_len_freq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::ifstream::~ifstream(&clusters);
  return;
}

Assistant:

void statistics(string & clusters_path){

	ifstream clusters;
	clusters.open(clusters_path, ios::in | ios::binary);

	uint64_t MAX_C_LEN = max_clust_length;

	//init with max cluster length 200
	auto clust_len_freq = vector<uint64_t>(MAX_C_LEN+1,0);

	uint64_t max_len = 0;

	while(not clusters.eof()){

		//read entry in clusters

		uint64_t start;
		uint16_t length;

		clusters.read((char*)&start, sizeof(uint64_t));
		clusters.read((char*)&length, sizeof(uint16_t));

		if(length <= MAX_C_LEN){

			clust_len_freq[length]++;
			max_len = length>max_len ? length : max_len;

		}

		n_clust++;
		n_bases+=length;

	}

	uint64_t max = 0;
	for(int i=1;i<=MAX_C_LEN;++i) max = clust_len_freq[i]*i > max ? clust_len_freq[i]*i : max;

	uint64_t cumulative = 0;

	cout << "\nDistribution of base coverage: "<< endl;
	cout << "\ncluster length\t# bases in a cluster with this length\t cumulative fraction (from 2m = " << 2*mcov_out << ")" << endl;
	for(int i=0;i<=max_len;++i){

		cout << i << "\t" << flush;
		for(uint64_t j=0;j<(100*clust_len_freq[i]*i)/max;++j) cout << "-" << flush;
		cout << "\t" << clust_len_freq[i]*i << flush;

		if(i>=2*mcov_out){

			cumulative += clust_len_freq[i]*i;
			cout << "\t" << double(cumulative)/double(n_bases);

		}

		cout << endl;


	}

	//auto-detect max cluster length

	max_clust_length = 2*mcov_out;//start from the minimum cluster length
	cumulative = clust_len_freq[max_clust_length]*max_clust_length;//cumulative number of bases

	while( double(cumulative)/double(n_bases) < pval and  max_clust_length < MAX_C_LEN){

		max_clust_length++;
		cumulative += clust_len_freq[max_clust_length]*max_clust_length;

	}

/*	max = 0;
	for(int i=1;i<=MAX_C_LEN;++i) max = clust_len_freq[i] > max ? clust_len_freq[i] : max;

	cout << "\nDistribution of cluster length: "<< endl;
	cout << "\ncluster length\t# clusters with this length" << endl;
	for(int i=0;i<=max_len;++i){

		cout << i << "\t" << flush;
		for(uint64_t j=0;j<(100*clust_len_freq[i])/max;++j) cout << "-" << flush;
		cout << "   " << clust_len_freq[i] << endl;


	}*/

	cout << "\nCluster sizes allowed: [" << mcov_out*2 << "," << max_clust_length << "]" << endl;

	clusters.close();

}